

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

LY_ERR lyb_print_node_leaf(ly_out *out,lyd_node *node,lyd_lyb_ctx *lybctx)

{
  LY_ERR ret___1;
  LY_ERR ret__;
  lyd_lyb_ctx *lybctx_local;
  lyd_node *node_local;
  ly_out *out_local;
  
  out_local._4_4_ = lyb_print_node_header(out,node,lybctx);
  if ((out_local._4_4_ == LY_SUCCESS) &&
     (out_local._4_4_ = lyb_print_term_value((lyd_node_term *)node,out,lybctx->lybctx),
     out_local._4_4_ == LY_SUCCESS)) {
    out_local._4_4_ = LY_SUCCESS;
  }
  return out_local._4_4_;
}

Assistant:

static LY_ERR
lyb_print_node_leaf(struct ly_out *out, const struct lyd_node *node, struct lyd_lyb_ctx *lybctx)
{
    /* write necessary basic data */
    LY_CHECK_RET(lyb_print_node_header(out, node, lybctx));

    /* write term value */
    LY_CHECK_RET(lyb_print_term_value((struct lyd_node_term *)node, out, lybctx->lybctx));

    return LY_SUCCESS;
}